

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

lword writesection(GlobalVars *gv,uint8_t *dest,Reloc *r,lword v)

{
  char cVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  long v_00;
  uint n;
  uint be;
  bool bVar6;
  RelocInsert *pRVar7;
  ulong uVar8;
  lword v_01;
  bool local_44;
  
  cVar1 = gv->endianess;
  uVar8 = (ulong)r->rtype;
  if (uVar8 < 0x23) {
    if ((0x700000734U >> (uVar8 & 0x3f) & 1) != 0) {
      bVar3 = 1;
      local_44 = 1;
      goto LAB_0010fa9a;
    }
    if (uVar8 == 0) {
      return 0;
    }
  }
  local_44 = 0;
  bVar3 = 0;
LAB_0010fa9a:
  pRVar7 = r->insert;
  if (pRVar7 != (RelocInsert *)0x0) {
    do {
      be = (uint)(cVar1 != '\0');
      writereloc(be,dest,(uint)pRVar7->bpos,(uint)pRVar7->bsiz,0);
      pRVar7 = pRVar7->next;
    } while (pRVar7 != (RelocInsert *)0x0);
    for (pRVar7 = r->insert; pRVar7 != (RelocInsert *)0x0; pRVar7 = pRVar7->next) {
      uVar8 = pRVar7->mask;
      uVar2 = pRVar7->bpos;
      n = (uint)pRVar7->bsiz;
      iVar4 = lshiftcnt(uVar8);
      v_01 = (long)(uVar8 & v) >> ((byte)iVar4 & 0x3f);
      bVar6 = (bool)(-1 < (long)uVar8 & bVar3);
      if (bVar6) {
        v_01 = sign_extend(v_01,n);
      }
      bVar5 = checkrange(v_01,local_44,n);
      if (bVar5 == 0) {
        return v_01;
      }
      v_00 = readreloc(be,dest,(uint)uVar2,n);
      if (bVar6) {
        v_00 = sign_extend(v_00,n);
      }
      writereloc(be,dest,(uint)uVar2,n,v_00 + v_01);
    }
  }
  return 0;
}

Assistant:

lword writesection(struct GlobalVars *gv,uint8_t *dest,struct Reloc *r,lword v)
/* Write 'v' into the bit-field defined by the relocation type in 'r'.
   Do range checks first, depending on the reloc type.
   Returns 0 on success or the masked and normalized value which failed
   on the range check. */
{
  bool be = gv->endianess != _LITTLE_ENDIAN_;
  uint8_t t = r->rtype;
  bool signedval = t==R_PC||t==R_GOTPC||t==R_GOTOFF||t==R_PLTPC||t==R_PLTOFF||
                   t==R_SD||t==R_SD2||t==R_SD21||t==R_MOSDREL;
  struct RelocInsert *ri;

  if (t == R_NONE)
    return 0;

  /* Reset all relocation fields to zero. */
  for (ri=r->insert; ri!=NULL; ri=ri->next)
    writereloc(be,dest,ri->bpos,ri->bsiz,0);

  /* add value to relocation fields */
  for (ri=r->insert; ri!=NULL; ri=ri->next) {
    lword mask = ri->mask;
    lword insval = v & mask;
    lword oldval;
    int bpos = ri->bpos;
    int bsiz = ri->bsiz;

    insval >>= lshiftcnt(mask);  /* normalize according mask */
    if (mask>=0 && signedval)
      insval = sign_extend(insval,bsiz);

    if (!checkrange(insval,signedval,bsiz))
      return insval;  /* range check failed on 'insval' */

    /* add to value already present in this field */
    oldval = readreloc(be,dest,bpos,bsiz);
    if (mask>=0 && signedval)
      oldval = sign_extend(oldval,bsiz);
    writereloc(be,dest,bpos,bsiz,oldval+insval);
  }

  return 0;
}